

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O2

void heap_insert(heap_t *p,uint entry)

{
  vec_int_t *pvVar1;
  vec_uint_t *p_00;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int *piVar5;
  char *__function;
  uint uVar6;
  char *__file;
  char *__assertion;
  uint idx;
  
  pvVar1 = p->indices;
  uVar6 = pvVar1->size;
  uVar3 = entry + 1;
  if (uVar6 < uVar3) {
    pvVar1->size = uVar3;
    if (pvVar1->cap < uVar3) {
      piVar5 = (int *)realloc(pvVar1->data,(ulong)uVar3 << 2);
      pvVar1->data = piVar5;
      if (piVar5 == (int *)0x0) {
        __assertion = "p->data != NULL";
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_int.h"
        ;
        __function = "void vec_int_resize(vec_int_t *, unsigned int)";
        uVar3 = 0x5e;
        goto LAB_0046ce3a;
      }
      pvVar1->cap = uVar3;
    }
    for (; uVar6 < p->indices->size; uVar6 = uVar6 + 1) {
      vec_int_at(p->indices,uVar6);
      vec_int_assign(p->indices,uVar6,-1);
    }
  }
  iVar2 = heap_in_heap(p,entry);
  if (iVar2 == 0) {
    vec_int_assign(p->indices,entry,p->data->size);
    vec_uint_push_back(p->data,entry);
    uVar3 = vec_int_at(p->indices,entry);
    uVar6 = vec_uint_at(p->data,uVar3);
    while (uVar3 != 0) {
      idx = uVar3 - 1 >> 1;
      uVar4 = vec_uint_at(p->data,idx);
      iVar2 = compare(p,uVar6,uVar4);
      if (iVar2 == 0) break;
      p_00 = p->data;
      uVar4 = vec_uint_at(p_00,idx);
      vec_uint_assign(p_00,uVar3,uVar4);
      pvVar1 = p->indices;
      uVar4 = vec_uint_at(p->data,idx);
      vec_int_assign(pvVar1,uVar4,uVar3);
      uVar3 = idx;
    }
    vec_uint_assign(p->data,uVar3,uVar6);
    vec_int_assign(p->indices,uVar6,uVar3);
    return;
  }
  __assertion = "!heap_in_heap(p, entry)";
  __file = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/heap.h"
  ;
  __function = "void heap_insert(heap_t *, unsigned int)";
  uVar3 = 0x7f;
LAB_0046ce3a:
  __assert_fail(__assertion,__file,uVar3,__function);
}

Assistant:

static inline void heap_insert(heap_t *p, unsigned entry)
{
    if (vec_int_size(p->indices) < entry + 1) {
        unsigned old_size = vec_int_size(p->indices);
        unsigned i;
        int e;
        vec_int_resize(p->indices, entry + 1);
        vec_int_foreach_start(p->indices, e, i, old_size)
            vec_int_assign(p->indices, i, -1);
    }
    assert(!heap_in_heap(p, entry));
    vec_int_assign(p->indices, entry, (int) vec_uint_size(p->data));
    vec_uint_push_back(p->data, entry);
    heap_percolate_up(p, (unsigned) vec_int_at(p->indices, entry));
}